

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sticky.cpp
# Opt level: O1

void __thiscall OpenMD::Sticky::addType(Sticky *this,AtomType *atomType)

{
  undefined8 *puVar1;
  size_t sVar2;
  long lVar3;
  RealType RVar4;
  double dVar5;
  double dVar6;
  bool bVar7;
  CubicSpline *this_00;
  CubicSpline *this_01;
  _Base_ptr p_Var8;
  long lVar9;
  int iVar10;
  long lVar11;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dc_04;
  undefined4 extraout_XMM0_Dc_05;
  undefined4 extraout_XMM0_Dc_06;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  undefined4 extraout_XMM0_Dd_03;
  undefined4 extraout_XMM0_Dd_04;
  undefined4 extraout_XMM0_Dd_05;
  undefined4 extraout_XMM0_Dd_06;
  undefined4 uVar12;
  pair<std::_Rb_tree_iterator<int>,_bool> pVar13;
  int atid;
  StickyAdapter sticky2;
  StickyAdapter sticky1;
  uint local_12c;
  undefined1 local_128 [16];
  Sticky *local_118;
  double local_110;
  double local_108;
  double local_100;
  StickyAdapter local_f8;
  StickyAdapter local_f0;
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  long local_b0;
  _Base_ptr local_a8;
  long local_a0;
  size_t local_98;
  _Base_ptr local_90;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  local_f0.at_ = atomType;
  local_12c = AtomType::getIdent(atomType);
  sVar2 = (this->Stypes)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  pVar13 = std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
           _M_insert_unique<int_const&>
                     ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                      &this->Stypes,(int *)&local_12c);
  if (pVar13.second == false) {
    snprintf(painCave.errMsg,2000,"Sticky already had a previous entry with ident %d\n",
             (ulong)local_12c);
    painCave.isFatal = 0;
    painCave.severity = 3;
    simError();
  }
  iVar10 = (int)sVar2;
  (this->Stids).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start[(int)local_12c] = iVar10;
  lVar11 = (long)iVar10;
  local_a0 = lVar11 * 3;
  local_98 = sVar2;
  std::vector<OpenMD::StickyInteractionData,_std::allocator<OpenMD::StickyInteractionData>_>::resize
            ((this->MixingMap).
             super__Vector_base<std::vector<OpenMD::StickyInteractionData,_std::allocator<OpenMD::StickyInteractionData>_>,_std::allocator<std::vector<OpenMD::StickyInteractionData,_std::allocator<OpenMD::StickyInteractionData>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + lVar11,(long)this->nSticky_);
  p_Var8 = (this->Stypes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_a8 = &(this->Stypes)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (p_Var8 != local_a8) {
    local_b0 = lVar11 * 0x58;
    local_118 = this;
    do {
      iVar10 = (local_118->Stids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[(int)p_Var8[1]._M_color];
      lVar11 = (long)iVar10;
      local_f8.at_ = ForceField::getAtomType(local_118->forceField_,p_Var8[1]._M_color);
      RVar4 = StickyAdapter::getRl(&local_f0);
      local_e8._8_4_ = extraout_XMM0_Dc;
      local_e8._0_8_ = RVar4;
      local_e8._12_4_ = extraout_XMM0_Dd;
      RVar4 = StickyAdapter::getRl(&local_f8);
      local_c8._8_4_ = extraout_XMM0_Dc_00;
      local_c8._0_8_ = RVar4;
      local_c8._12_4_ = extraout_XMM0_Dd_00;
      RVar4 = StickyAdapter::getRu(&local_f0);
      local_48._8_4_ = extraout_XMM0_Dc_01;
      local_48._0_8_ = RVar4;
      local_48._12_4_ = extraout_XMM0_Dd_01;
      RVar4 = StickyAdapter::getRu(&local_f8);
      local_58._8_4_ = extraout_XMM0_Dc_02;
      local_58._0_8_ = RVar4;
      local_58._12_4_ = extraout_XMM0_Dd_02;
      RVar4 = StickyAdapter::getRlp(&local_f0);
      local_68._8_4_ = extraout_XMM0_Dc_03;
      local_68._0_8_ = RVar4;
      local_68._12_4_ = extraout_XMM0_Dd_03;
      RVar4 = StickyAdapter::getRlp(&local_f8);
      local_d8._8_4_ = extraout_XMM0_Dc_04;
      local_d8._0_8_ = RVar4;
      local_d8._12_4_ = extraout_XMM0_Dd_04;
      RVar4 = StickyAdapter::getRup(&local_f0);
      local_78._8_4_ = extraout_XMM0_Dc_05;
      local_78._0_8_ = RVar4;
      local_78._12_4_ = extraout_XMM0_Dd_05;
      RVar4 = StickyAdapter::getRup(&local_f8);
      local_88._8_4_ = extraout_XMM0_Dc_06;
      local_88._0_8_ = RVar4;
      local_88._12_4_ = extraout_XMM0_Dd_06;
      RVar4 = StickyAdapter::getW0(&local_f0);
      local_128._0_8_ = RVar4;
      RVar4 = StickyAdapter::getW0(&local_f8);
      dVar5 = RVar4 * (double)local_128._0_8_;
      if (dVar5 < 0.0) {
        local_100 = sqrt(dVar5);
      }
      else {
        local_100 = SQRT(dVar5);
      }
      RVar4 = StickyAdapter::getV0(&local_f0);
      local_128._0_8_ = RVar4;
      RVar4 = StickyAdapter::getV0(&local_f8);
      dVar5 = RVar4 * (double)local_128._0_8_;
      if (dVar5 < 0.0) {
        local_108 = sqrt(dVar5);
      }
      else {
        local_108 = SQRT(dVar5);
      }
      RVar4 = StickyAdapter::getV0p(&local_f0);
      local_128._0_8_ = RVar4;
      RVar4 = StickyAdapter::getV0p(&local_f8);
      dVar5 = RVar4 * (double)local_128._0_8_;
      if (dVar5 < 0.0) {
        local_110 = sqrt(dVar5);
      }
      else {
        local_110 = SQRT(dVar5);
      }
      bVar7 = StickyAdapter::isStickyPower(&local_f0);
      if (bVar7) {
        bVar7 = StickyAdapter::isStickyPower(&local_f8);
      }
      else {
        bVar7 = false;
      }
      this_00 = (CubicSpline *)operator_new(0xa0);
      CubicSpline::CubicSpline(this_00);
      dVar5 = ((double)local_c8._0_8_ + (double)local_e8._0_8_) * 0.5;
      dVar6 = ((double)local_58._0_8_ + (double)local_48._0_8_) * 0.5;
      uVar12 = (undefined4)((ulong)dVar6 >> 0x20);
      local_128._8_4_ = SUB84(dVar6,0);
      local_128._0_8_ = dVar6;
      local_128._12_4_ = uVar12;
      local_c8._8_4_ = SUB84(dVar6,0);
      local_c8._0_8_ = dVar5;
      local_c8._12_4_ = uVar12;
      local_90 = p_Var8;
      CubicSpline::addPoint(this_00,dVar5,1.0);
      CubicSpline::addPoint(this_00,(RealType)local_128._0_8_,0.0);
      this_01 = (CubicSpline *)operator_new(0xa0);
      CubicSpline::CubicSpline(this_01);
      dVar5 = ((double)local_d8._0_8_ + (double)local_68._0_8_) * 0.5;
      local_e8._8_8_ = ((double)local_88._0_8_ + (double)local_78._0_8_) * 0.5;
      uVar12 = (undefined4)((ulong)local_e8._8_8_ >> 0x20);
      local_d8._8_4_ = (int)local_e8._8_8_;
      local_d8._0_8_ = dVar5;
      local_d8._12_4_ = uVar12;
      local_e8._0_8_ = local_e8._8_8_;
      dVar6 = (double)local_e8._8_8_;
      if ((double)local_e8._8_8_ <= (double)local_128._0_8_) {
        dVar6 = (double)local_128._0_8_;
      }
      local_128._8_4_ = (int)local_e8._8_8_;
      local_128._0_8_ = dVar6;
      local_128._12_4_ = uVar12;
      CubicSpline::addPoint(this_01,dVar5,1.0);
      CubicSpline::addPoint(this_01,(RealType)local_e8._0_8_,0.0);
      std::vector<OpenMD::StickyInteractionData,_std::allocator<OpenMD::StickyInteractionData>_>::
      resize((this->MixingMap).
             super__Vector_base<std::vector<OpenMD::StickyInteractionData,_std::allocator<OpenMD::StickyInteractionData>_>,_std::allocator<std::vector<OpenMD::StickyInteractionData,_std::allocator<OpenMD::StickyInteractionData>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + lVar11,(long)this->nSticky_);
      lVar3 = *(long *)((long)&(((this->MixingMap).
                                 super__Vector_base<std::vector<OpenMD::StickyInteractionData,_std::allocator<OpenMD::StickyInteractionData>_>,_std::allocator<std::vector<OpenMD::StickyInteractionData,_std::allocator<OpenMD::StickyInteractionData>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super__Vector_base<OpenMD::StickyInteractionData,_std::allocator<OpenMD::StickyInteractionData>_>
                               )._M_impl.super__Vector_impl_data + local_a0 * 8);
      lVar9 = lVar11 * 0x58;
      *(undefined8 *)(lVar3 + lVar9) = local_c8._0_8_;
      ((undefined8 *)(lVar3 + lVar9))[1] = local_c8._8_8_;
      puVar1 = (undefined8 *)(lVar3 + 0x10 + lVar9);
      *puVar1 = local_d8._0_8_;
      puVar1[1] = local_d8._8_8_;
      *(undefined8 *)(lVar3 + 0x20 + lVar9) = local_128._0_8_;
      *(double *)(lVar3 + 0x28 + lVar9) = local_100;
      *(double *)(lVar3 + 0x30 + lVar9) = local_108;
      *(double *)(lVar3 + 0x38 + lVar9) = local_110;
      *(CubicSpline **)(lVar3 + 0x40 + lVar9) = this_00;
      *(CubicSpline **)(lVar3 + 0x48 + lVar9) = this_01;
      *(bool *)(lVar3 + 0x50 + lVar9) = bVar7;
      if (iVar10 != (int)local_98) {
        lVar11 = *(long *)&(local_118->MixingMap).
                           super__Vector_base<std::vector<OpenMD::StickyInteractionData,_std::allocator<OpenMD::StickyInteractionData>_>,_std::allocator<std::vector<OpenMD::StickyInteractionData,_std::allocator<OpenMD::StickyInteractionData>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[lVar11].
                           super__Vector_base<OpenMD::StickyInteractionData,_std::allocator<OpenMD::StickyInteractionData>_>
                           ._M_impl.super__Vector_impl_data;
        *(undefined8 *)(lVar11 + local_b0) = local_c8._0_8_;
        ((undefined8 *)(lVar11 + local_b0))[1] = local_c8._8_8_;
        puVar1 = (undefined8 *)(lVar11 + 0x10 + local_b0);
        *puVar1 = local_d8._0_8_;
        puVar1[1] = local_d8._8_8_;
        *(undefined8 *)(lVar11 + 0x20 + local_b0) = local_128._0_8_;
        *(double *)(lVar11 + 0x28 + local_b0) = local_100;
        *(double *)(lVar11 + 0x30 + local_b0) = local_108;
        *(double *)(lVar11 + 0x38 + local_b0) = local_110;
        *(CubicSpline **)(lVar11 + 0x40 + local_b0) = this_00;
        *(CubicSpline **)(lVar11 + 0x48 + local_b0) = this_01;
        *(bool *)(lVar11 + 0x50 + local_b0) = bVar7;
      }
      p_Var8 = (_Base_ptr)std::_Rb_tree_increment(local_90);
    } while (p_Var8 != local_a8);
  }
  return;
}

Assistant:

void Sticky::addType(AtomType* atomType) {
    StickyAdapter sticky1 = StickyAdapter(atomType);

    // add it to the map:

    int atid = atomType->getIdent();
    int stid = Stypes.size();

    pair<set<int>::iterator, bool> ret;
    ret = Stypes.insert(atid);
    if (ret.second == false) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "Sticky already had a previous entry with ident %d\n", atid);
      painCave.severity = OPENMD_INFO;
      painCave.isFatal  = 0;
      simError();
    }

    Stids[atid] = stid;
    MixingMap[stid].resize(nSticky_);

    // Now, iterate over all known types and add to the mixing map:

    std::set<int>::iterator it;
    for (it = Stypes.begin(); it != Stypes.end(); ++it) {
      int stid2             = Stids[(*it)];
      AtomType* atype2      = forceField_->getAtomType((*it));
      StickyAdapter sticky2 = StickyAdapter(atype2);

      StickyInteractionData mixer;

      // Mixing two different sticky types is silly, but if you want 2
      // sticky types in your simulation, we'll let you do it with the
      // Lorentz- Berthelot mixing rules (which happen to do the right thing
      // when atomType and atype2 happen to be the same.

      mixer.rl      = 0.5 * (sticky1.getRl() + sticky2.getRl());
      mixer.ru      = 0.5 * (sticky1.getRu() + sticky2.getRu());
      mixer.rlp     = 0.5 * (sticky1.getRlp() + sticky2.getRlp());
      mixer.rup     = 0.5 * (sticky1.getRup() + sticky2.getRup());
      mixer.rbig    = max(mixer.ru, mixer.rup);
      mixer.w0      = sqrt(sticky1.getW0() * sticky2.getW0());
      mixer.v0      = sqrt(sticky1.getV0() * sticky2.getV0());
      mixer.v0p     = sqrt(sticky1.getV0p() * sticky2.getV0p());
      mixer.isPower = sticky1.isStickyPower() && sticky2.isStickyPower();

      CubicSpline* s = new CubicSpline();
      s->addPoint(mixer.rl, 1.0);
      s->addPoint(mixer.ru, 0.0);
      mixer.s = s;

      CubicSpline* sp = new CubicSpline();
      sp->addPoint(mixer.rlp, 1.0);
      sp->addPoint(mixer.rup, 0.0);
      mixer.sp = sp;

      MixingMap[stid2].resize(nSticky_);

      MixingMap[stid][stid2] = mixer;
      if (stid2 != stid) { MixingMap[stid2][stid] = mixer; }
    }
  }